

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O1

CallResult __thiscall miniros::PeerConnDisconnCallback::call(PeerConnDisconnCallback *this)

{
  int iVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  CallResult CVar3;
  bool bVar4;
  SingleSubscriberPublisher pub;
  SingleSubscriberPublisher SStack_28;
  
  if (this->use_tracked_object_ == true) {
    this_00 = (this->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar2 = this_00->_M_use_count;
      do {
        if (iVar2 == 0) {
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar1 = this_00->_M_use_count;
        bVar4 = iVar2 == iVar1;
        if (bVar4) {
          this_00->_M_use_count = iVar2 + 1;
          iVar1 = iVar2;
        }
        iVar2 = iVar1;
        UNLOCK();
      } while (!bVar4);
    }
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = this_00->_M_use_count == 0;
    }
    CVar3 = Invalid;
    if ((bVar4) ||
       ((this->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0)) goto LAB_001f4730;
  }
  else {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  SingleSubscriberPublisher::SingleSubscriberPublisher(&SStack_28,&this->sub_link_);
  if ((this->callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_,&SStack_28);
  SingleSubscriberPublisher::~SingleSubscriberPublisher(&SStack_28);
  CVar3 = Success;
LAB_001f4730:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return CVar3;
}

Assistant:

virtual CallResult call()
  {
    VoidConstPtr tracker;
    if (use_tracked_object_)
    {
      tracker = tracked_object_.lock();

      if (!tracker)
      {
        return Invalid;
      }
    }

    SingleSubscriberPublisher pub(sub_link_);
    callback_(pub);

    return Success;
  }